

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_object.h
# Opt level: O3

void __thiscall CameraBase::saveFrame(CameraBase *this,Mat *frame_left,Mat *frame_right)

{
  Size **ppSVar1;
  char cVar2;
  size_t sVar3;
  FileStorage *pFVar4;
  undefined8 uVar5;
  FileStorage fsr;
  FileStorage fsl;
  char fileName [1024];
  ulong *local_4f8;
  undefined8 uStack_4f0;
  ulong local_4e8 [2];
  _InputArray local_4d8 [2];
  undefined1 *local_498 [2];
  undefined1 local_488 [48];
  undefined1 *local_458;
  undefined8 local_450;
  undefined1 local_448 [16];
  char local_438 [1032];
  
  if (this->m_saveFrames != false) {
    snprintf(local_438,0x400,"images/left_%d.png",(ulong)(uint)this->m_frameCount);
    local_498[0] = local_488;
    sVar3 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,local_438,local_438 + sVar3)
    ;
    local_4d8[0].sz.width = 0;
    local_4d8[0].sz.height = 0;
    local_4d8[0].flags = 0x1010000;
    local_4e8[0] = 0;
    local_4f8 = (ulong *)0x0;
    uStack_4f0 = 0;
    local_4d8[0].obj = frame_left;
    cv::imwrite((string *)local_498,local_4d8,(vector *)&local_4f8);
    if (local_4f8 != (ulong *)0x0) {
      operator_delete(local_4f8);
    }
    if (local_498[0] != local_488) {
      operator_delete(local_498[0]);
    }
    snprintf(local_438,0x400,"images/right_%d.png",(ulong)(uint)this->m_frameCount);
    local_498[0] = local_488;
    sVar3 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,local_438,local_438 + sVar3)
    ;
    local_4d8[0].sz.width = 0;
    local_4d8[0].sz.height = 0;
    local_4d8[0].flags = 0x1010000;
    local_4e8[0] = 0;
    local_4f8 = (ulong *)0x0;
    uStack_4f0 = 0;
    local_4d8[0].obj = frame_right;
    cv::imwrite((string *)local_498,local_4d8,(vector *)&local_4f8);
    if (local_4f8 != (ulong *)0x0) {
      operator_delete(local_4f8);
    }
    if (local_498[0] != local_488) {
      operator_delete(local_498[0]);
    }
    snprintf(local_438,0x400,"images/left_%d.yml",(ulong)(uint)this->m_frameCount);
    ppSVar1 = (Size **)&local_4d8[0].sz;
    local_4d8[0]._0_8_ = ppSVar1;
    sVar3 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,local_438,local_438 + sVar3)
    ;
    uStack_4f0 = 0;
    local_4e8[0] = local_4e8[0] & 0xffffffffffffff00;
    local_4f8 = local_4e8;
    cv::FileStorage::FileStorage
              ((FileStorage *)local_498,(string *)local_4d8,1,(string *)&local_4f8);
    if (local_4f8 != local_4e8) {
      operator_delete(local_4f8);
    }
    if ((Size **)local_4d8[0]._0_8_ != ppSVar1) {
      operator_delete((void *)local_4d8[0]._0_8_);
    }
    local_4d8[0].sz._0_6_ = 0x6567616d69;
    local_4d8[0].obj = (void *)0x5;
    local_4d8[0]._0_8_ = ppSVar1;
    pFVar4 = (FileStorage *)cv::operator<<((FileStorage *)local_498,(string *)local_4d8);
    if ((Size **)local_4d8[0]._0_8_ != ppSVar1) {
      operator_delete((void *)local_4d8[0]._0_8_);
    }
    cVar2 = (**(code **)(*(long *)pFVar4 + 0x18))(pFVar4);
    if (cVar2 != '\0') {
      if (*(int *)(pFVar4 + 8) == 6) {
        local_4d8[0]._0_8_ = ppSVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4d8,"No element name has been given","");
        cv::error(-2,(string *)local_4d8,"operator<<",
                  "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
        goto LAB_00102f3b;
      }
      cv::write(pFVar4,(string *)(pFVar4 + 0x10),frame_left);
      if (((byte)pFVar4[8] & 4) != 0) {
        *(undefined4 *)(pFVar4 + 8) = 6;
      }
    }
    snprintf(local_438,0x400,"images/right_%d.yml",(ulong)(uint)this->m_frameCount);
    local_4f8 = local_4e8;
    sVar3 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4f8,local_438,local_438 + sVar3);
    local_450 = 0;
    local_448[0] = 0;
    local_458 = local_448;
    cv::FileStorage::FileStorage
              ((FileStorage *)local_4d8,(string *)&local_4f8,1,(string *)&local_458);
    if (local_458 != local_448) {
      operator_delete(local_458);
    }
    if (local_4f8 != local_4e8) {
      operator_delete(local_4f8);
    }
    local_4e8[0] = CONCAT26(local_4e8[0]._6_2_,0x6567616d69);
    uStack_4f0 = 5;
    local_4f8 = local_4e8;
    pFVar4 = (FileStorage *)cv::operator<<((FileStorage *)local_4d8,(string *)&local_4f8);
    if (local_4f8 != local_4e8) {
      operator_delete(local_4f8);
    }
    cVar2 = (**(code **)(*(long *)pFVar4 + 0x18))(pFVar4);
    if (cVar2 != '\0') {
      if (*(int *)(pFVar4 + 8) == 6) {
LAB_00102f3b:
        local_4f8 = local_4e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4f8,"No element name has been given","");
        uVar5 = cv::error(-2,(string *)&local_4f8,"operator<<",
                          "/usr/include/opencv4/opencv2/core/persistence.hpp",0x4c8);
        if (local_4f8 != local_4e8) {
          operator_delete(local_4f8);
        }
        cv::FileStorage::~FileStorage((FileStorage *)local_4d8);
        cv::FileStorage::~FileStorage((FileStorage *)local_498);
        _Unwind_Resume(uVar5);
      }
      cv::write(pFVar4,(string *)(pFVar4 + 0x10),frame_right);
      if (((byte)pFVar4[8] & 4) != 0) {
        *(undefined4 *)(pFVar4 + 8) = 6;
      }
    }
    cv::FileStorage::~FileStorage((FileStorage *)local_4d8);
    cv::FileStorage::~FileStorage((FileStorage *)local_498);
  }
  return;
}

Assistant:

void    saveFrame (cv::Mat &frame_left, cv::Mat &frame_right) {
                if (false == m_saveFrames) return;
                char fileName[1024];
                snprintf (fileName, sizeof (fileName), "images/left_%d.png", m_frameCount);
                imwrite (fileName, frame_left);
                snprintf (fileName, sizeof (fileName), "images/right_%d.png", m_frameCount);
                imwrite (fileName, frame_right);
                {
                    snprintf (fileName, sizeof (fileName), "images/left_%d.yml", m_frameCount);
                    cv::FileStorage fsl (fileName, cv::FileStorage::WRITE);
                    fsl << "image" << frame_left;
                    snprintf (fileName, sizeof (fileName), "images/right_%d.yml", m_frameCount);
                    cv::FileStorage fsr (fileName, cv::FileStorage::WRITE);
                    fsr << "image" << frame_right;
                }
              }